

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIScrollBar::refreshControls(CGUIScrollBar *this)

{
  IGUIButton *pIVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  byte bVar5;
  u32 uVar6;
  uint uVar7;
  EGUI_ALIGNMENT EVar8;
  int iVar9;
  long *plVar10;
  long lVar11;
  CGUIButton *pCVar12;
  EGUI_ALIGNMENT EVar13;
  int iVar14;
  int iVar15;
  rect<int> rectangle;
  rect<int> local_40;
  
  (this->CurrentIconColor).color = 0xffffffff;
  plVar10 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  if (plVar10 == (long *)0x0) {
    lVar11 = 0;
  }
  else {
    lVar11 = (**(code **)(*plVar10 + 0x40))(plVar10);
    bVar5 = (**(code **)(*(long *)this + 0x90))(this);
    uVar6 = (**(code **)*plVar10)(plVar10,(uint)(bVar5 ^ 1) + (uint)(bVar5 ^ 1) * 2 + 0x12);
    (this->CurrentIconColor).color = uVar6;
  }
  if (this->Horizontal == true) {
    iVar15 = *(int *)&this->field_0x3c - *(int *)&this->field_0x34;
    iVar14 = (*(int *)&this->field_0x38 - *(int *)&this->field_0x30) / 2;
    if (iVar15 < iVar14) {
      iVar14 = iVar15;
    }
    if (this->UpButton == (IGUIButton *)0x0) {
      pCVar12 = (CGUIButton *)operator_new(0x2a8);
      auVar2._4_4_ = iVar15;
      auVar2._0_4_ = iVar14;
      auVar2._8_8_ = 0;
      CGUIButton::CGUIButton
                (pCVar12,*(IGUIEnvironment **)&this->field_0x128,(IGUIElement *)this,-1,
                 (rect<int>)(auVar2 << 0x40),(bool)this->field_0xa3);
      this->UpButton = (IGUIButton *)pCVar12;
      (**(code **)(*(long *)pCVar12 + 0x88))(pCVar12,1);
      (this->UpButton->super_IGUIElement).IsTabStop = false;
    }
    if (lVar11 != 0) {
      (*(this->UpButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x31])
                (this->UpButton,lVar11);
      pIVar1 = this->UpButton;
      uVar7 = (**(code **)(*plVar10 + 0x50))(plVar10,7);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,0,(ulong)uVar7,(ulong)(this->CurrentIconColor).color,0,0);
      pIVar1 = this->UpButton;
      uVar7 = (**(code **)(*plVar10 + 0x50))(plVar10,7);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,1,(ulong)uVar7,(ulong)(this->CurrentIconColor).color,0,0);
    }
    local_40.UpperLeftCorner.X = 0;
    local_40.UpperLeftCorner.Y = 0;
    local_40.LowerRightCorner.X = iVar14;
    local_40.LowerRightCorner.Y = iVar15;
    IGUIElement::setRelativePosition(&this->UpButton->super_IGUIElement,&local_40);
    pIVar1 = this->UpButton;
    (pIVar1->super_IGUIElement).AlignLeft = EGUIA_UPPERLEFT;
    (pIVar1->super_IGUIElement).AlignRight = EGUIA_UPPERLEFT;
    (pIVar1->super_IGUIElement).AlignTop = EGUIA_UPPERLEFT;
    (pIVar1->super_IGUIElement).AlignBottom = EGUIA_LOWERRIGHT;
    if (this->DownButton == (IGUIButton *)0x0) {
      pCVar12 = (CGUIButton *)operator_new(0x2a8);
      rectangle.LowerRightCorner.X = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
      rectangle.UpperLeftCorner.X = rectangle.LowerRightCorner.X - iVar14;
      rectangle.UpperLeftCorner.Y = 0;
      rectangle.LowerRightCorner.Y = iVar15;
      CGUIButton::CGUIButton
                (pCVar12,*(IGUIEnvironment **)&this->field_0x128,(IGUIElement *)this,-1,rectangle,
                 (bool)this->field_0xa3);
      this->DownButton = (IGUIButton *)pCVar12;
      (**(code **)(*(long *)pCVar12 + 0x88))(pCVar12,1);
      (this->DownButton->super_IGUIElement).IsTabStop = false;
    }
    if (lVar11 != 0) {
      (*(this->DownButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x31])
                (this->DownButton,lVar11);
      pIVar1 = this->DownButton;
      uVar7 = (**(code **)(*plVar10 + 0x50))(plVar10,8);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,0,(ulong)uVar7,(ulong)(this->CurrentIconColor).color,0,0);
      pIVar1 = this->DownButton;
      uVar7 = (**(code **)(*plVar10 + 0x50))(plVar10,8);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,1,(ulong)uVar7,(ulong)(this->CurrentIconColor).color,0,0);
    }
    local_40.LowerRightCorner.X = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
    local_40.UpperLeftCorner.Y = 0;
    local_40.UpperLeftCorner.X = local_40.LowerRightCorner.X - iVar14;
    local_40.LowerRightCorner.Y = iVar15;
    IGUIElement::setRelativePosition(&this->DownButton->super_IGUIElement,&local_40);
    EVar8 = EGUIA_UPPERLEFT;
    EVar13 = EGUIA_LOWERRIGHT;
  }
  else {
    iVar15 = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
    iVar14 = (*(int *)&this->field_0x3c - *(int *)&this->field_0x34) / 2;
    if (iVar15 < iVar14) {
      iVar14 = iVar15;
    }
    if (this->UpButton == (IGUIButton *)0x0) {
      pCVar12 = (CGUIButton *)operator_new(0x2a8);
      auVar3._4_4_ = iVar14;
      auVar3._0_4_ = iVar15;
      auVar3._8_8_ = 0;
      CGUIButton::CGUIButton
                (pCVar12,*(IGUIEnvironment **)&this->field_0x128,(IGUIElement *)this,-1,
                 (rect<int>)(auVar3 << 0x40),(bool)this->field_0xa3);
      this->UpButton = (IGUIButton *)pCVar12;
      (**(code **)(*(long *)pCVar12 + 0x88))(pCVar12,1);
      (this->UpButton->super_IGUIElement).IsTabStop = false;
    }
    if (lVar11 != 0) {
      (*(this->UpButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x31])
                (this->UpButton,lVar11);
      pIVar1 = this->UpButton;
      uVar7 = (**(code **)(*plVar10 + 0x50))(plVar10,5);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,0,(ulong)uVar7,(ulong)(this->CurrentIconColor).color,0,0);
      pIVar1 = this->UpButton;
      uVar7 = (**(code **)(*plVar10 + 0x50))(plVar10,5);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,1,(ulong)uVar7,(ulong)(this->CurrentIconColor).color,0,0);
    }
    local_40.UpperLeftCorner.X = 0;
    local_40.UpperLeftCorner.Y = 0;
    local_40.LowerRightCorner.X = iVar15;
    local_40.LowerRightCorner.Y = iVar14;
    IGUIElement::setRelativePosition(&this->UpButton->super_IGUIElement,&local_40);
    pIVar1 = this->UpButton;
    (pIVar1->super_IGUIElement).AlignLeft = EGUIA_UPPERLEFT;
    (pIVar1->super_IGUIElement).AlignRight = EGUIA_LOWERRIGHT;
    (pIVar1->super_IGUIElement).AlignTop = EGUIA_UPPERLEFT;
    (pIVar1->super_IGUIElement).AlignBottom = EGUIA_UPPERLEFT;
    if (this->DownButton == (IGUIButton *)0x0) {
      pCVar12 = (CGUIButton *)operator_new(0x2a8);
      iVar9 = *(int *)&this->field_0x3c - *(int *)&this->field_0x34;
      auVar4._8_4_ = iVar9;
      auVar4._4_4_ = iVar15;
      auVar4._0_4_ = iVar9 - iVar14;
      auVar4._12_4_ = 0;
      CGUIButton::CGUIButton
                (pCVar12,*(IGUIEnvironment **)&this->field_0x128,(IGUIElement *)this,-1,
                 (rect<int>)(auVar4 << 0x20),(bool)this->field_0xa3);
      this->DownButton = (IGUIButton *)pCVar12;
      (**(code **)(*(long *)pCVar12 + 0x88))(pCVar12,1);
      (this->DownButton->super_IGUIElement).IsTabStop = false;
    }
    if (lVar11 != 0) {
      (*(this->DownButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x31])
                (this->DownButton,lVar11);
      pIVar1 = this->DownButton;
      uVar7 = (**(code **)(*plVar10 + 0x50))(plVar10,6);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,0,(ulong)uVar7,(ulong)(this->CurrentIconColor).color,0,0);
      pIVar1 = this->DownButton;
      uVar7 = (**(code **)(*plVar10 + 0x50))(plVar10,6);
      (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
                (pIVar1,1,(ulong)uVar7,(ulong)(this->CurrentIconColor).color,0,0);
    }
    local_40.LowerRightCorner.Y = *(int *)&this->field_0x3c - *(int *)&this->field_0x34;
    local_40.UpperLeftCorner =
         (vector2d<int>)((ulong)(uint)(local_40.LowerRightCorner.Y - iVar14) << 0x20);
    local_40.LowerRightCorner.X = iVar15;
    IGUIElement::setRelativePosition(&this->DownButton->super_IGUIElement,&local_40);
    EVar8 = EGUIA_LOWERRIGHT;
    EVar13 = EGUIA_UPPERLEFT;
  }
  pIVar1 = this->DownButton;
  (pIVar1->super_IGUIElement).AlignLeft = EVar13;
  (pIVar1->super_IGUIElement).AlignRight = EGUIA_LOWERRIGHT;
  (pIVar1->super_IGUIElement).AlignTop = EVar8;
  (pIVar1->super_IGUIElement).AlignBottom = EGUIA_LOWERRIGHT;
  return;
}

Assistant:

void CGUIScrollBar::refreshControls()
{
	CurrentIconColor = video::SColor(255, 255, 255, 255);

	IGUISkin *skin = Environment->getSkin();
	IGUISpriteBank *sprites = 0;

	if (skin) {
		sprites = skin->getSpriteBank();
		CurrentIconColor = skin->getColor(isEnabled() ? EGDC_WINDOW_SYMBOL : EGDC_GRAY_WINDOW_SYMBOL);
	}

	if (Horizontal) {
		const s32 h = RelativeRect.getHeight();
		const s32 w = (h < RelativeRect.getWidth() / 2) ? h : RelativeRect.getWidth() / 2;
		if (!UpButton) {
			UpButton = new CGUIButton(Environment, this, -1, core::rect<s32>(0, 0, w, h), NoClip);
			UpButton->setSubElement(true);
			UpButton->setTabStop(false);
		}
		if (sprites) {
			UpButton->setSpriteBank(sprites);
			UpButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_LEFT), CurrentIconColor);
			UpButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_LEFT), CurrentIconColor);
		}
		UpButton->setRelativePosition(core::rect<s32>(0, 0, w, h));
		UpButton->setAlignment(EGUIA_UPPERLEFT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT);
		if (!DownButton) {
			DownButton = new CGUIButton(Environment, this, -1, core::rect<s32>(RelativeRect.getWidth() - w, 0, RelativeRect.getWidth(), h), NoClip);
			DownButton->setSubElement(true);
			DownButton->setTabStop(false);
		}
		if (sprites) {
			DownButton->setSpriteBank(sprites);
			DownButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_RIGHT), CurrentIconColor);
			DownButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_RIGHT), CurrentIconColor);
		}
		DownButton->setRelativePosition(core::rect<s32>(RelativeRect.getWidth() - w, 0, RelativeRect.getWidth(), h));
		DownButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT);
	} else {
		const s32 w = RelativeRect.getWidth();
		const s32 h = (w < RelativeRect.getHeight() / 2) ? w : RelativeRect.getHeight() / 2;
		if (!UpButton) {
			UpButton = new CGUIButton(Environment, this, -1, core::rect<s32>(0, 0, w, h), NoClip);
			UpButton->setSubElement(true);
			UpButton->setTabStop(false);
		}
		if (sprites) {
			UpButton->setSpriteBank(sprites);
			UpButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_UP), CurrentIconColor);
			UpButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_UP), CurrentIconColor);
		}
		UpButton->setRelativePosition(core::rect<s32>(0, 0, w, h));
		UpButton->setAlignment(EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
		if (!DownButton) {
			DownButton = new CGUIButton(Environment, this, -1, core::rect<s32>(0, RelativeRect.getHeight() - h, w, RelativeRect.getHeight()), NoClip);
			DownButton->setSubElement(true);
			DownButton->setTabStop(false);
		}
		if (sprites) {
			DownButton->setSpriteBank(sprites);
			DownButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_DOWN), CurrentIconColor);
			DownButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_DOWN), CurrentIconColor);
		}
		DownButton->setRelativePosition(core::rect<s32>(0, RelativeRect.getHeight() - h, w, RelativeRect.getHeight()));
		DownButton->setAlignment(EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT);
	}
}